

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrum.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_cb49ff::Joystick::Joystick(Joystick *this)

{
  initializer_list<Inputs::Joystick::Input> __l;
  allocator<Inputs::Joystick::Input> local_89;
  Input local_88;
  Input local_78;
  Input local_68;
  Input local_58;
  Input local_48;
  Input *local_38;
  size_type local_30;
  vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_> local_28;
  Joystick *local_10;
  Joystick *this_local;
  
  local_10 = this;
  Inputs::Joystick::Input::Input(&local_88,Up,0);
  Inputs::Joystick::Input::Input(&local_78,Down,0);
  Inputs::Joystick::Input::Input(&local_68,Left,0);
  Inputs::Joystick::Input::Input(&local_58,Right,0);
  Inputs::Joystick::Input::Input(&local_48,Fire,0);
  local_30 = 5;
  local_38 = &local_88;
  std::allocator<Inputs::Joystick::Input>::allocator(&local_89);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>::vector
            (&local_28,__l,&local_89);
  Inputs::ConcreteJoystick::ConcreteJoystick(&this->super_ConcreteJoystick,&local_28);
  std::vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>::~vector(&local_28)
  ;
  std::allocator<Inputs::Joystick::Input>::~allocator(&local_89);
  (this->super_ConcreteJoystick).super_Joystick._vptr_Joystick =
       (_func_int **)&PTR__Joystick_00ca72b8;
  this->kempston_ = '\0';
  this->sinclair_ = 0xffff;
  return;
}

Assistant:

Joystick() :
			ConcreteJoystick({
				Input(Input::Up),
				Input(Input::Down),
				Input(Input::Left),
				Input(Input::Right),
				Input(Input::Fire)
			}) {}